

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lucas.c
# Opt level: O1

void calc_statistics(float (*correct_vels) [512] [2],float (*norm_vels1) [512] [2],
                    float (*norm_vels2) [512] [2],int int_size_x,int int_size_y,
                    float (*full_vels) [512] [2],float (*E) [512],int pic_x,int pic_y,int n,
                    float *ave_error,float *st_dev,float *density,float *residual,float *min_angle,
                    float *max_angle,float *norm_ave_error1,float *norm_st_dev1,float *norm_density1
                    ,float *norm_min_angle1,float *norm_max_angle1,float *norm_ave_error2,
                    float *norm_st_dev2,float *norm_density2,float *norm_min_angle2,
                    float *norm_max_angle2)

{
  double dVar1;
  double dVar2;
  float (*paafVar3) [512] [2];
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  FILE *__stream;
  ulong uVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  float fVar19;
  float fVar20;
  undefined4 uVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float histogram_error2 [100];
  float histogram_error [100];
  int histogram_count [100];
  ulong local_618;
  float local_608;
  float local_604;
  float local_600;
  undefined4 local_5fc;
  float (*local_5f8) [512];
  ulong local_5f0;
  uint local_5e4;
  uint local_5e0;
  uint local_5dc;
  undefined8 local_5d8;
  undefined4 uStack_5d0;
  undefined4 uStack_5cc;
  float (*local_5c0) [512] [2];
  double local_5b8;
  undefined8 uStack_5b0;
  float (*local_5a0) [512] [2];
  float *local_598;
  float *local_590;
  float *local_588;
  float *local_580;
  float *local_578;
  int local_570;
  int local_56c;
  double local_568;
  undefined8 uStack_560;
  float *local_550;
  float *local_548;
  ulong local_540;
  float *local_538;
  float *local_530;
  float *local_528;
  float *local_520;
  float *local_518;
  float (*local_510) [512] [2];
  float *local_508;
  float *local_500;
  float *local_4f8;
  float *local_4f0;
  float local_4e8 [100];
  float local_358 [100];
  uint local_1c8 [102];
  
  local_550 = norm_density2;
  local_548 = norm_st_dev2;
  local_598 = norm_ave_error2;
  uVar12 = (ulong)(uint)n;
  local_5f0 = (ulong)(uint)pic_y;
  local_5f8 = E;
  local_590 = min_angle;
  *min_angle = INFINITY;
  local_588 = norm_min_angle1;
  *norm_min_angle1 = INFINITY;
  local_530 = max_angle;
  *max_angle = 0.0;
  local_520 = norm_max_angle1;
  *norm_max_angle1 = 0.0;
  local_578 = norm_min_angle2;
  *norm_min_angle2 = INFINITY;
  local_580 = norm_max_angle2;
  *norm_max_angle2 = 0.0;
  local_538 = residual;
  *residual = 0.0;
  local_508 = density;
  *density = 0.0;
  local_4f8 = st_dev;
  *st_dev = 0.0;
  local_518 = ave_error;
  *ave_error = 0.0;
  local_500 = norm_density1;
  *norm_density1 = 0.0;
  local_4f0 = norm_st_dev1;
  *norm_st_dev1 = 0.0;
  local_528 = norm_ave_error1;
  *norm_ave_error1 = 0.0;
  *norm_density2 = 0.0;
  *norm_st_dev2 = 0.0;
  uVar10 = 0;
  *norm_ave_error2 = 0.0;
  local_5d8 = norm_vels2;
  local_5c0 = norm_vels1;
  local_5a0 = full_vels;
  local_540 = uVar12;
  local_510 = correct_vels;
  memset(local_4e8,0,400);
  memset(local_358,0,400);
  memset(local_1c8,0,400);
  local_56c = pic_x - n;
  local_5dc = 0;
  local_5e4 = 0;
  iVar11 = 0;
  local_618 = 0;
  local_5e0 = 0;
  uStack_5d0 = 0;
  uStack_5cc = 0;
  local_568 = 0.0;
  uStack_560 = 0;
  local_5b8 = 0.0;
  uStack_5b0 = 0;
  uVar9 = 0;
  fVar20 = 0.0;
  uVar21 = 0;
  if (n < local_56c) {
    local_570 = (int)local_5f0 - n;
    lVar13 = (long)n;
    local_5f0 = (ulong)(uint)((int)local_5f0 + n * -2);
    lVar16 = lVar13 * 0x1008;
    lVar17 = (long)local_5a0 + lVar16 + 4;
    lVar18 = (long)local_510 + lVar16 + 4;
    local_5f8 = (float (*) [512])((long)local_5f8 + lVar13 * 0x804);
    lVar14 = (long)local_5c0 + lVar16 + 4;
    lVar16 = (long)local_5d8 + lVar16 + 4;
    local_5c0 = (float (*) [512] [2])((long)Imag + lVar13 * 0x804);
    local_5b8 = 0.0;
    uStack_5b0 = 0;
    uVar9 = 0;
    local_568 = 0.0;
    uStack_560 = 0;
    local_5e0 = 0;
    local_618 = 0;
    iVar11 = 0;
    local_5e4 = 0;
    local_5dc = 0;
    uVar10 = 0;
    local_5d8._0_4_ = 0.0;
    local_5d8._4_4_ = 0;
    do {
      if ((int)uVar12 < local_570) {
        local_5a0 = (float (*) [512] [2])CONCAT44(local_5a0._4_4_,iVar11 + (int)(float)local_5f0);
        lVar15 = 0;
        do {
          fVar20 = *(float *)(lVar17 + -4 + lVar15 * 8);
          if ((fVar20 != 100.0) || (NAN(fVar20))) {
            fVar19 = *(float *)(lVar17 + lVar15 * 8);
            if ((fVar19 == 100.0) && (!NAN(fVar19))) goto LAB_00103816;
            local_600 = *(float *)(lVar18 + -4 + lVar15 * 8);
            local_5fc = *(undefined4 *)(lVar18 + lVar15 * 8);
            local_608 = fVar20;
            local_604 = fVar19;
            fVar19 = PsiER(&local_608,&local_600);
            *local_518 = *local_518 + fVar19;
            fVar20 = (*local_5f8)[lVar15];
            if ((fVar20 == 100.0) && (!NAN(fVar20))) {
              puts("Fatal error: E has no value");
              exit(1);
            }
            *local_538 = fVar20 + *local_538;
            if (fVar19 < *local_590) {
              *local_590 = fVar19;
            }
            uVar9 = uVar9 + 1;
            local_5b8 = (double)CONCAT44(local_5b8._4_4_,local_5b8._0_4_ + fVar19 * fVar19);
            if (*local_530 <= fVar19 && fVar19 != *local_530) {
              *local_530 = fVar19;
            }
          }
          else {
LAB_00103816:
            local_5dc = local_5dc + 1;
          }
          fVar20 = *(float *)(lVar14 + -4 + lVar15 * 8);
          if ((fVar20 != 100.0) || (NAN(fVar20))) {
            fVar19 = *(float *)(lVar14 + lVar15 * 8);
            if ((fVar19 == 100.0) && (!NAN(fVar19))) goto LAB_001038e8;
            local_600 = *(float *)(lVar18 + -4 + lVar15 * 8);
            local_5fc = *(undefined4 *)(lVar18 + lVar15 * 8);
            local_608 = fVar20;
            local_604 = fVar19;
            fVar20 = PsiEN(&local_608,&local_600);
            *local_528 = *local_528 + fVar20;
            if (fVar20 < *local_588) {
              *local_588 = fVar20;
            }
            uVar10 = uVar10 + 1;
            local_568 = (double)CONCAT44(local_568._4_4_,local_568._0_4_ + fVar20 * fVar20);
            if (*local_520 <= fVar20 && fVar20 != *local_520) {
              *local_520 = fVar20;
            }
          }
          else {
LAB_001038e8:
            local_5e4 = local_5e4 + 1;
          }
          fVar20 = *(float *)(lVar16 + -4 + lVar15 * 8);
          if ((fVar20 != 100.0) || (NAN(fVar20))) {
            fVar19 = *(float *)(lVar16 + lVar15 * 8);
            if ((fVar19 == 100.0) && (!NAN(fVar19))) goto LAB_00103a03;
            local_600 = *(float *)(lVar18 + -4 + lVar15 * 8);
            local_5fc = *(undefined4 *)(lVar18 + lVar15 * 8);
            local_608 = fVar20;
            local_604 = fVar19;
            fVar20 = PsiEN(&local_608,&local_600);
            *local_598 = *local_598 + fVar20;
            if (fVar20 < *local_578) {
              *local_578 = fVar20;
            }
            if (*local_580 <= fVar20 && fVar20 != *local_580) {
              *local_580 = fVar20;
            }
            local_618 = (ulong)((int)local_618 + 1);
            local_5d8._0_4_ = (float)local_5d8 + fVar20 * fVar20;
            iVar11 = (int)(*local_5c0)[0][lVar15];
            if (0x18 < iVar11) {
              iVar11 = 0x19;
            }
            local_358[iVar11] = local_358[iVar11] + fVar20;
            local_4e8[iVar11] = fVar20 * fVar20 + local_4e8[iVar11];
            local_1c8[iVar11] = local_1c8[iVar11] + 1;
          }
          else {
LAB_00103a03:
            local_5e0 = local_5e0 + 1;
          }
          lVar15 = lVar15 + 1;
        } while ((float)local_5f0 != (float)(int)lVar15);
        uVar12 = local_540;
        iVar11 = (int)local_5a0;
      }
      lVar13 = lVar13 + 1;
      lVar17 = lVar17 + 0x1000;
      lVar18 = lVar18 + 0x1000;
      local_5f8 = local_5f8 + 1;
      lVar14 = lVar14 + 0x1000;
      lVar16 = lVar16 + 0x1000;
      local_5c0 = (float (*) [512] [2])(*local_5c0 + 0x100);
      fVar20 = (float)local_5d8;
      uVar21 = local_5d8._4_4_;
    } while (local_56c != (int)lVar13);
  }
  pfVar8 = local_518;
  pfVar7 = local_520;
  pfVar6 = local_528;
  pfVar5 = local_530;
  pfVar4 = local_598;
  local_5d8 = (float (*) [512] [2])CONCAT44(uVar21,fVar20);
  fVar24 = (float)(int)uVar9;
  local_5a0 = (float (*) [512] [2])CONCAT44(local_5a0._4_4_,iVar11);
  fVar23 = (float)iVar11;
  *local_508 = (fVar24 * 100.0) / fVar23;
  fVar19 = (float)(int)uVar10;
  *local_500 = (fVar19 * 100.0) / fVar23;
  fVar20 = (float)(int)local_618;
  local_5f0 = CONCAT44(local_5f0._4_4_,fVar23);
  *local_550 = (fVar20 * 100.0) / fVar23;
  fVar23 = 0.0;
  if (uVar9 != 0) {
    fVar23 = *local_518 / fVar24;
  }
  *local_518 = fVar23;
  fVar23 = 0.0;
  fVar22 = 0.0;
  if (uVar10 != 0) {
    fVar22 = *local_528 / fVar19;
  }
  *local_528 = fVar22;
  if ((int)local_618 != 0) {
    fVar23 = *local_598 / fVar20;
  }
  *local_598 = fVar23;
  fVar23 = 0.0;
  if (1 < (int)uVar9) {
    fVar23 = ABS((local_5b8._0_4_ - fVar24 * *local_518 * *local_518) / (float)(int)(uVar9 - 1));
    if (fVar23 < 0.0) {
      local_5b8 = (double)CONCAT44(local_5b8._4_4_,fVar24);
      local_5f8 = (float (*) [512])CONCAT44(local_5f8._4_4_,fVar20);
      local_5c0 = (float (*) [512] [2])CONCAT44(local_5c0._4_4_,fVar19);
      fVar23 = sqrtf(fVar23);
      fVar20 = local_5f8._0_4_;
      fVar19 = local_5c0._0_4_;
      fVar24 = local_5b8._0_4_;
    }
    else {
      fVar23 = SQRT(fVar23);
    }
  }
  fVar22 = 0.0;
  *local_4f8 = fVar23;
  if (1 < (int)uVar10) {
    fVar23 = *pfVar6;
    fVar22 = (local_568._0_4_ - fVar19 * fVar23 * fVar23) / (float)(int)(uVar10 - 1);
    if (fVar22 < 0.0) {
      local_5b8 = (double)CONCAT44(local_5b8._4_4_,fVar24);
      local_5f8 = (float (*) [512])CONCAT44(local_5f8._4_4_,fVar20);
      fVar22 = sqrtf(fVar22);
      fVar20 = local_5f8._0_4_;
      fVar24 = local_5b8._0_4_;
    }
    else {
      fVar22 = SQRT(fVar22);
    }
  }
  *local_4f0 = fVar22;
  fVar19 = 0.0;
  if (1 < (int)local_618) {
    fVar19 = *pfVar4;
    fVar19 = ((float)local_5d8 - fVar20 * fVar19 * fVar19) / (float)((int)local_618 + -1);
    if (fVar19 < 0.0) {
      local_5b8 = (double)CONCAT44(local_5b8._4_4_,fVar24);
      fVar19 = sqrtf(fVar19);
      fVar24 = local_5b8._0_4_;
    }
    else {
      fVar19 = SQRT(fVar19);
    }
  }
  paafVar3 = local_5a0;
  *local_548 = fVar19;
  if (uVar9 != 0) {
    *local_538 = *local_538 / fVar24;
  }
  if ((*pfVar8 == 0.0) && (!NAN(*pfVar8))) {
    *pfVar5 = 0.0;
    *local_590 = 0.0;
  }
  fVar20 = *pfVar6;
  if ((fVar20 == 0.0) && (!NAN(fVar20))) {
    *pfVar7 = 0.0;
    *local_588 = 0.0;
  }
  fVar20 = *pfVar4;
  iVar11 = (int)local_5a0;
  if ((fVar20 == 0.0) && (!NAN(fVar20))) {
    *local_580 = 0.0;
    *local_578 = 0.0;
  }
  puts("\nIn calc_statistics");
  printf("%d full velocities\n",(ulong)uVar9);
  printf("%d positons without full velocity\n",(ulong)local_5dc);
  printf("%d positions in total\n",(ulong)paafVar3 & 0xffffffff);
  printf("%d least squares normal velocities\n",(ulong)uVar10);
  printf("%d positons without least squares normal velocity\n",(ulong)local_5e4);
  printf("%d positions with full or least squares normal velocity\n",
         (ulong)(iVar11 - (uVar10 + uVar9)));
  printf("%d raw normal velocities\n",local_618);
  printf("%d positons without raw normal velocity\n",(ulong)local_5e0);
  __stream = fopen("lucas.plot.data","w");
  fprintf(__stream,"%d\n",0x19);
  if (RAW_STATISTICS != 0) {
    puts("\n                             Raw Normal Velocity Analysis");
    puts("\n                                  Histogram Error\n");
    lVar16 = 0;
    do {
      uVar9 = local_1c8[lVar16];
      if (uVar9 == 0) {
        fVar20 = 0.0;
      }
      else {
        fVar20 = local_358[lVar16] / (float)(int)uVar9;
      }
      dVar1 = 0.0;
      if (1 < (int)uVar9) {
        dVar1 = (double)((local_4e8[lVar16] - (float)(int)uVar9 * fVar20 * fVar20) /
                        ((float)(int)uVar9 + -1.0));
      }
      if (ABS(dVar1) < 0.0) {
        local_5d8 = (float (*) [512] [2])CONCAT44(local_5d8._4_4_,fVar20);
        dVar1 = sqrt(ABS(dVar1));
      }
      else {
        dVar1 = SQRT(ABS(dVar1));
        local_5d8._0_4_ = fVar20;
      }
      dVar2 = (double)(float)local_5d8;
      local_5d8 = (float (*) [512] [2])((double)(int)lVar16 + 0.5);
      printf("Bin:%5.2f Average Error:%8.5f St. Dev:%8.5f Count:%5d Density:%6.3f\n",(ulong)uVar9);
      fprintf(__stream,"%f %f %f %f\n",(int)local_5d8,SUB84(dVar2,0),SUB84((double)(float)dVar1,0));
      lVar16 = lVar16 + 1;
    } while (lVar16 != 0x19);
    fwrite("\n\n\n",3,1,__stream);
    lVar16 = 0;
    fprintf(__stream,"%d\n",0x19);
    puts("\n                                 Cumulative Error\n");
    fVar20 = 0.0;
    uVar9 = 0;
    fVar19 = 0.0;
    do {
      fVar20 = fVar20 + local_358[lVar16];
      fVar19 = fVar19 + local_4e8[lVar16];
      uVar9 = uVar9 + local_1c8[lVar16];
      lVar16 = lVar16 + 1;
    } while (lVar16 != 0x19);
    lVar16 = 0;
    do {
      fVar24 = (float)(int)uVar9;
      fVar23 = 0.0;
      if (uVar9 != 0) {
        fVar23 = fVar20 / fVar24;
      }
      local_5d8 = (float (*) [512] [2])CONCAT44(local_5d8._4_4_,fVar20);
      dVar1 = 0.0;
      if (1 < (int)uVar9) {
        dVar1 = (double)((fVar19 - fVar24 * fVar23 * fVar23) / (float)(int)(uVar9 - 1));
      }
      if (ABS(dVar1) < 0.0) {
        dVar1 = sqrt(ABS(dVar1));
      }
      else {
        dVar1 = SQRT(ABS(dVar1));
      }
      local_568 = (double)(float)dVar1;
      local_5b8 = (double)((fVar24 * 100.0) / (float)local_5f0);
      printf("Bin:>%5.2f Average Error:%8.5f St. Dev:%8.5f Count:%5d Density:%6.3f\n",(ulong)uVar9);
      fprintf(__stream,"%f %f %f %f\n",SUB84((double)(int)lVar16,0),SUB84((double)fVar23,0),
              SUB84(local_568,0),local_5b8);
      fVar20 = (float)local_5d8 - local_358[lVar16];
      fVar19 = fVar19 - local_4e8[lVar16];
      uVar9 = uVar9 - local_1c8[lVar16];
      lVar16 = lVar16 + 1;
    } while (lVar16 != 0x19);
    fputc(10,__stream);
    fclose(__stream);
  }
  fflush(_stdout);
  return;
}

Assistant:

void calc_statistics(float correct_vels[PIC_X][PIC_Y][2],
				float norm_vels1[PIC_X][PIC_Y][2],
				float norm_vels2[PIC_X][PIC_Y][2],
				int int_size_x, int int_size_y,
				float full_vels[PIC_X][PIC_Y][2],
				float E[PIC_X][PIC_Y], int pic_x,
				int pic_y, int n, float *ave_error,
				float *st_dev,float *density, float *residual,
				float *min_angle, float *max_angle,
				float *norm_ave_error1,float *norm_st_dev1,
				float *norm_density1, float *norm_min_angle1,
				float *norm_max_angle1, float *norm_ave_error2,
				float *norm_st_dev2, float *norm_density2,
				float *norm_min_angle2, float *norm_max_angle2)
{
FILE *fp;
int full_count,norm_count1,no_full_count,no_norm_count1,i,j,total_count;
int norm_count2,no_norm_count2;
float normal_sumX2_1,normal_sumX2_2,sumX2,temp,uva[2],uve[2],bin_err2;
float histogram_error[100],histogram_error2[100],bin_sum,bin_ave,bin_st_dev;
float bin_density;
int histogram_count[100],int_mag,bin_ct;

full_count = norm_count1 = norm_count2 = no_full_count = no_norm_count1 = no_norm_count2 = total_count = 0;
normal_sumX2_1 = normal_sumX2_2 = sumX2 = 0.0;
(*norm_min_angle1) = (*min_angle) = (float) HUGE_VAL;
(*norm_max_angle1) = (*max_angle) = 0.0f;
(*norm_min_angle2) = (float) HUGE_VAL;
(*norm_max_angle2) = 0.0f;
(*ave_error) = (*st_dev) = (*density) = (*residual) = 0.0f;
(*norm_ave_error1) = (*norm_st_dev1) = (*norm_density1) = 0.0f;
(*norm_ave_error2) = (*norm_st_dev2) = (*norm_density2) = 0.0f;

for(i=0;i<100;i++) { histogram_error[i]=histogram_error2[i]=0.0; histogram_count[i]=0; }


for(i=n;i<pic_x-n;i++)
{
for(j=n;j<pic_y-n;j++)
	{
	if(full_vels[i][j][0] != NO_VALUE && full_vels[i][j][1] != NO_VALUE)
	  {
	  full_count++;
	  uve[0] = full_vels[i][j][0]; uve[1] = full_vels[i][j][1];
	  uva[0] = correct_vels[i][j][0]; uva[1] = correct_vels[i][j][1];
	  temp = PsiER(uve,uva);
	  (*ave_error) += temp;
	  if(E[i][j] == NO_VALUE)
		{ printf("Fatal error: E has no value\n"); exit(1); }
	  (*residual) += E[i][j];
	  sumX2 += temp*temp;
	  if(temp < (*min_angle)) (*min_angle) = temp;
	  if(temp > (*max_angle)) (*max_angle) = temp;
	  }
	else no_full_count++;

	if(norm_vels1[i][j][0] != NO_VALUE && norm_vels1[i][j][1] != NO_VALUE)
	  {
	  norm_count1++;
	  uve[0] = norm_vels1[i][j][0]; uve[1] = norm_vels1[i][j][1];
	  uva[0] = correct_vels[i][j][0]; uva[1] = correct_vels[i][j][1];
	  temp = PsiEN(uve,uva);
	  (*norm_ave_error1) += temp;
	  normal_sumX2_1 += temp*temp;
	  if(temp < (*norm_min_angle1)) (*norm_min_angle1) = temp;
	  if(temp > (*norm_max_angle1)) (*norm_max_angle1) = temp;
	  }
	else no_norm_count1++;

	if(norm_vels2[i][j][0] != NO_VALUE && norm_vels2[i][j][1] != NO_VALUE)
	  {
	  norm_count2++;
	  uve[0] = norm_vels2[i][j][0]; uve[1] = norm_vels2[i][j][1];
	  uva[0] = correct_vels[i][j][0]; uva[1] = correct_vels[i][j][1];
	  temp = PsiEN(uve,uva);
	  (*norm_ave_error2) += temp;
	  normal_sumX2_2 += temp*temp;
	  if(temp < (*norm_min_angle2)) (*norm_min_angle2) = temp;
	  if(temp > (*norm_max_angle2)) (*norm_max_angle2) = temp;
	  int_mag = (int) (Imag[i][j]);
	  if(int_mag >= MAX_I) int_mag = MAX_I;
	  histogram_error[int_mag] += temp;
	  histogram_error2[int_mag] += temp*temp;
	  histogram_count[int_mag]++;
	  }
	else no_norm_count2++;

	total_count++;
	}
}
(*density) = (full_count*100.0f)/(total_count);
(*norm_density1) = (norm_count1*100.0f)/(total_count);
(*norm_density2) = (norm_count2*100.0f)/(total_count);

if(full_count != 0) (*ave_error) = (*ave_error)/full_count;
else (*ave_error) = 0.0;
if(norm_count1 != 0) (*norm_ave_error1) = (*norm_ave_error1)/norm_count1;
else (*norm_ave_error1) = 0.0;
if(norm_count2 != 0) (*norm_ave_error2) = (*norm_ave_error2)/norm_count2;
else (*norm_ave_error2) = 0.0;

if(full_count > 1)
{
temp =(float) (fabs((sumX2 - full_count*(*ave_error)*(*ave_error))/(full_count-1)));
(*st_dev) = (float) sqrt(temp);
}
else (*st_dev) = 0.0f;
if(norm_count1 > 1)
(*norm_st_dev1) = (float) (sqrt((normal_sumX2_1 - norm_count1*(*norm_ave_error1)*(*norm_ave_error1))/(norm_count1-1)));
else (*norm_st_dev1) = 0.0;
if(norm_count2 > 1)
(*norm_st_dev2) = (float) (sqrt((normal_sumX2_2 - norm_count2*(*norm_ave_error2)*(*norm_ave_error2))/(norm_count2-1)));
else (*norm_st_dev2) = 0.0;

if(full_count != 0) (*residual) = (*residual)/full_count;
if((*ave_error) == 0.0) { (*min_angle) = (*max_angle) = 0.0; }
if((*norm_ave_error1) == 0.0) { (*norm_min_angle1) = (*norm_max_angle1) = 0.0; }
if((*norm_ave_error2) == 0.0) { (*norm_min_angle2) = (*norm_max_angle2) = 0.0; }

printf("\nIn calc_statistics\n");
printf("%d full velocities\n",full_count);
printf("%d positons without full velocity\n",no_full_count);
printf("%d positions in total\n",total_count);
printf("%d least squares normal velocities\n",norm_count1);
printf("%d positons without least squares normal velocity\n",no_norm_count1);
printf("%d positions with full or least squares normal velocity\n",
	total_count-full_count-norm_count1);
printf("%d raw normal velocities\n",norm_count2);
printf("%d positons without raw normal velocity\n",no_norm_count2);

fp =fopen("lucas.plot.data","w");
fprintf(fp,"%d\n",MAX_I);
if(RAW_STATISTICS)
{
printf("\n                             Raw Normal Velocity Analysis\n");
printf("\n                                  Histogram Error\n\n");
for(i=0;i<MAX_I;i++)
	{
     	if(histogram_count[i] != 0.0) bin_ave = histogram_error[i]/(histogram_count[i]*1.0f);
     	else bin_ave = 0.0;
	if(histogram_count[i] > 1) temp = ((histogram_error2[i]-histogram_count[i]*bin_ave*bin_ave)/(histogram_count[i]-1.0f));
	else temp = 0.0;
	bin_density = histogram_count[i]*100.0f/total_count;
	bin_st_dev = (float) sqrt(fabs(temp));
     	printf("Bin:%5.2f Average Error:%8.5f St. Dev:%8.5f Count:%5d Density:%6.3f\n",i+0.5,bin_ave,bin_st_dev,histogram_count[i],bin_density);
     	fprintf(fp,"%f %f %f %f\n",i+0.5,bin_ave,bin_st_dev,bin_density);
	}
fprintf(fp,"\n\n\n");
fprintf(fp,"%d\n",MAX_I);
printf("\n                                 Cumulative Error\n\n");
bin_sum = 0.0; bin_ct=0; bin_err2 = 0.0;
for(i=0;i<MAX_I;i++)
     {
     bin_sum += histogram_error[i];
     bin_err2 += histogram_error2[i];
     bin_ct += histogram_count[i];
     }
for(i=0;i<MAX_I;i++)
     {
     if(bin_ct != 0) bin_ave = bin_sum/bin_ct; else bin_ave = 0.0;
     bin_density = bin_ct*100.0f/total_count;
     if(bin_ct > 1)  temp = ((bin_err2-bin_ct*bin_ave*bin_ave)/(bin_ct-1));
     else temp = 0.0;
     bin_st_dev = (float) sqrt(fabs(temp));
     printf("Bin:>%5.2f Average Error:%8.5f St. Dev:%8.5f Count:%5d Density:%6.3f\n",i*1.0,bin_ave,bin_st_dev,bin_ct,bin_density);
     fprintf(fp,"%f %f %f %f\n",i*1.0,bin_ave,bin_st_dev,bin_density);
     bin_sum -= histogram_error[i];
     bin_err2 -= histogram_error2[i];
     bin_ct -= histogram_count[i];
     }
fprintf(fp,"\n");
fclose(fp);
}
fflush(stdout);
}